

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O2

void __thiscall helics::udp::UdpServer::~UdpServer(UdpServer *this)

{
  socket *this_00;
  error_code ec;
  undefined4 local_28 [2];
  undefined8 local_20;
  
  this_00 = &this->mSocket;
  ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::cancel
            (&this_00->super_basic_socket<asio::ip::udp,_asio::any_io_executor>);
  local_28[0] = 0;
  local_20 = std::_V2::system_category();
  ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::close
            (&this_00->super_basic_socket<asio::ip::udp,_asio::any_io_executor>,(int)local_28);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->mDataCall);
  ::asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
  ~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
                   *)this_00);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<helics::udp::UdpServer>)._M_weak_this.
              super___weak_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

~UdpServer()
        {
            try {
                stop_receive();
            }
            catch (...) {
            }
            try {
                asio::error_code ec;
                mSocket.close(ec);
            }
            catch (...) {
            }
        }